

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64instapi.cpp
# Opt level: O3

Error asmjit::v1_14::a64::InstInternal::queryRWInfo
                (BaseInst *inst,Operand_ *operands,size_t opCount,InstRWInfo *out)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  OpRWInfo *pOVar6;
  ulong uVar7;
  OpRWFlags OVar8;
  ulong uVar9;
  OpRWFlags OVar10;
  Mem *memOp;
  ulong uVar11;
  bool bVar12;
  
  uVar3 = *(ushort *)inst;
  if (0x2fc < uVar3) {
    return 0x1a;
  }
  out->_instFlags = kNone;
  out->_readFlags = kNone;
  out->_opCount = (uint8_t)opCount;
  out->_rmFeature = '\0';
  (out->_extraReg)._opFlags = kNone;
  (out->_extraReg)._physId = '\0';
  (out->_extraReg)._rmSize = '\0';
  (out->_extraReg)._consecutiveLeadCount = '\0';
  (out->_extraReg)._reserved[0] = '\0';
  (out->_extraReg)._readByteMask = 0;
  (out->_extraReg)._writeByteMask = 0;
  (out->_extraReg)._extendByteMask = 0;
  out->_writeFlags = kNone;
  uVar4 = *(ushort *)(&DAT_00150f74 + (ulong)uVar3 * 8);
  if ((opCount < 3) || ((*(ushort *)(&DAT_00150f76 + (ulong)uVar3 * 8) & 0x80) == 0)) {
    if (opCount != 0) {
      uVar11 = 0;
      uVar7 = 1;
      do {
        pOVar6 = out->_operands + uVar11;
        if ((operands[uVar11]._signature._bits & 7) - 1 < 2) {
          bVar1 = instRWInfoData[uVar11 + (ulong)uVar4 * 6];
          OVar8 = bVar1 & ~kZExt;
          pOVar6->_opFlags = OVar8;
          pOVar6->_physId = 0xff;
          pOVar6->_rmSize = '\0';
          pOVar6->_consecutiveLeadCount = '\0';
          pOVar6->_reserved[0] = '\0';
          uVar9 = (ulong)((int)((uint)bVar1 << 0x1e) >> 0x1f);
          pOVar6->_readByteMask = -(ulong)(bVar1 & 1);
          pOVar6->_writeByteMask = uVar9;
          pOVar6->_extendByteMask = 0;
          uVar5 = operands[uVar11]._signature._bits;
          if ((uVar5 & 7) == 1) {
            if ((short)uVar5 < 0) {
              bVar2 = *(byte *)((long)&elementTypeSize + (ulong)(uVar5 >> 0xc & 7));
              uVar11 = (ulong)~(uint)(-1L << (bVar2 & 0x3f)) <<
                       (((byte)(uVar5 >> 0x10) & 0xf) * bVar2 & 0x3f);
              pOVar6->_readByteMask = -(ulong)(bVar1 & 1) & uVar11;
              pOVar6->_writeByteMask = uVar11 & uVar9;
            }
          }
          else {
            if ((uVar5 & 0xf8) == 0) {
LAB_001134db:
              OVar10 = OVar8;
              if ((uVar5 & 0x1f00) == 0) goto LAB_001134ec;
            }
            else {
              OVar10 = OVar8 + kMemBaseRead;
              pOVar6->_opFlags = OVar10;
              if ((uVar5 & 0x1f00) == 0) {
                if (((uVar5 & 0x3000000) == 0) || (operands[uVar11]._data[1] == 0))
                goto LAB_001134ec;
LAB_001134d3:
                OVar8 = OVar8 | kMemBaseRW;
                pOVar6->_opFlags = OVar8;
                goto LAB_001134db;
              }
              if ((uVar5 & 0x3000000) != 0) goto LAB_001134d3;
            }
            pOVar6->_opFlags = OVar10 | kMemIndexRead;
          }
        }
        else {
          pOVar6->_writeByteMask = 0;
          pOVar6->_extendByteMask = 0;
          pOVar6->_opFlags = kNone;
          pOVar6->_physId = '\0';
          pOVar6->_rmSize = '\0';
          pOVar6->_consecutiveLeadCount = '\0';
          pOVar6->_reserved[0] = '\0';
          pOVar6->_readByteMask = 0;
        }
LAB_001134ec:
        bVar12 = uVar7 < opCount;
        uVar11 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar12);
    }
  }
  else {
    uVar11 = 1;
    uVar7 = 0;
    do {
      uVar9 = uVar11;
      pOVar6 = out->_operands + uVar7;
      if ((operands[uVar7]._signature._bits & 7) - 1 < 2) {
        bVar1 = *(byte *)(((ulong)uVar4 * 6 + 0x150f01) - (ulong)(uVar7 < opCount - 1));
        OVar8 = bVar1 & ~kZExt;
        pOVar6->_opFlags = OVar8;
        pOVar6->_physId = 0xff;
        pOVar6->_rmSize = '\0';
        pOVar6->_consecutiveLeadCount = '\0';
        pOVar6->_reserved[0] = '\0';
        pOVar6->_readByteMask = -(ulong)(bVar1 & kRead);
        pOVar6->_writeByteMask = (long)((int)((uint)bVar1 << 0x1e) >> 0x1f);
        pOVar6->_extendByteMask = 0;
        uVar5 = operands[uVar7]._signature._bits;
        if ((uVar5 & 7) == 1) {
          if ((int)uVar9 == 1) {
            pOVar6->_consecutiveLeadCount = (uint8_t)(opCount - 1);
          }
          else {
            pOVar6->_opFlags = OVar8 | kConsecutive;
          }
        }
        else {
          if ((uVar5 & 0xf8) == 0) {
LAB_001133a0:
            OVar10 = OVar8;
            if ((uVar5 & 0x1f00) == 0) goto LAB_001133b1;
          }
          else {
            OVar10 = OVar8 + kMemBaseRead;
            pOVar6->_opFlags = OVar10;
            if ((uVar5 & 0x1f00) == 0) {
              if (((uVar5 & 0x3000000) == 0) || (operands[uVar7]._data[1] == 0)) goto LAB_001133b1;
LAB_00113396:
              OVar8 = OVar8 | kMemBaseRW;
              pOVar6->_opFlags = OVar8;
              goto LAB_001133a0;
            }
            if ((uVar5 & 0x3000000) != 0) goto LAB_00113396;
          }
          pOVar6->_opFlags = OVar10 | kMemIndexRead;
        }
      }
      else {
        pOVar6->_writeByteMask = 0;
        pOVar6->_extendByteMask = 0;
        pOVar6->_opFlags = kNone;
        pOVar6->_physId = '\0';
        pOVar6->_rmSize = '\0';
        pOVar6->_consecutiveLeadCount = '\0';
        pOVar6->_reserved[0] = '\0';
        pOVar6->_readByteMask = 0;
      }
LAB_001133b1:
      uVar11 = (ulong)((int)uVar9 + 1);
      uVar7 = uVar9;
    } while (uVar9 < opCount);
  }
  return 0;
}

Assistant:

Error queryRWInfo(const BaseInst& inst, const Operand_* operands, size_t opCount, InstRWInfo* out) noexcept {
  // Get the instruction data.
  uint32_t realId = inst.id() & uint32_t(InstIdParts::kRealId);

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(realId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  out->_instFlags = InstRWFlags::kNone;
  out->_opCount = uint8_t(opCount);
  out->_rmFeature = 0;
  out->_extraReg.reset();
  out->_readFlags = CpuRWFlags::kNone; // TODO: [ARM] Read PSTATUS.
  out->_writeFlags = CpuRWFlags::kNone; // TODO: [ARM] Write PSTATUS

  const InstDB::InstInfo& instInfo = InstDB::_instInfoTable[realId];
  const InstRWInfoData& rwInfo = instRWInfoData[instInfo.rwInfoIndex()];

  if (instInfo.hasFlag(InstDB::kInstFlagConsecutive) && opCount > 2) {
    for (uint32_t i = 0; i < opCount; i++) {
      OpRWInfo& op = out->_operands[i];
      const Operand_& srcOp = operands[i];

      if (!srcOp.isRegOrMem()) {
        op.reset();
        continue;
      }

      OpRWFlags rwFlags = i < opCount - 1 ? (OpRWFlags)rwInfo.rwx[0] : (OpRWFlags)rwInfo.rwx[1];

      op._opFlags = rwFlags & ~(OpRWFlags::kZExt);
      op._physId = BaseReg::kIdBad;
      op._rmSize = 0;
      op._resetReserved();

      uint64_t rByteMask = op.isRead() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;
      uint64_t wByteMask = op.isWrite() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;

      op._readByteMask = rByteMask;
      op._writeByteMask = wByteMask;
      op._extendByteMask = 0;
      op._consecutiveLeadCount = 0;

      if (srcOp.isReg()) {
        if (i == 0)
          op._consecutiveLeadCount = uint8_t(opCount - 1);
        else
          op.addOpFlags(OpRWFlags::kConsecutive);
      }
      else {
        const Mem& memOp = srcOp.as<Mem>();

        if (memOp.hasBase()) {
          op.addOpFlags(OpRWFlags::kMemBaseRead);
          if ((memOp.hasIndex() || memOp.hasOffset()) && memOp.isPreOrPost()) {
            op.addOpFlags(OpRWFlags::kMemBaseWrite);
          }
        }

        if (memOp.hasIndex()) {
          op.addOpFlags(OpRWFlags::kMemIndexRead);
        }
      }
    }
  }
  else {
    for (uint32_t i = 0; i < opCount; i++) {
      OpRWInfo& op = out->_operands[i];
      const Operand_& srcOp = operands[i];

      if (!srcOp.isRegOrMem()) {
        op.reset();
        continue;
      }

      OpRWFlags rwFlags = (OpRWFlags)rwInfo.rwx[i];

      op._opFlags = rwFlags & ~(OpRWFlags::kZExt);
      op._physId = BaseReg::kIdBad;
      op._rmSize = 0;
      op._resetReserved();

      uint64_t rByteMask = op.isRead() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;
      uint64_t wByteMask = op.isWrite() ? 0xFFFFFFFFFFFFFFFFu : 0x0000000000000000u;

      op._readByteMask = rByteMask;
      op._writeByteMask = wByteMask;
      op._extendByteMask = 0;
      op._consecutiveLeadCount = 0;

      if (srcOp.isReg()) {
        if (srcOp.as<Vec>().hasElementIndex()) {
          // Only part of the vector is accessed if element index [] is used.
          VecElementType elementType = srcOp.as<Vec>().elementType();
          uint32_t elementIndex = srcOp.as<Vec>().elementIndex();

          uint32_t elementSize = elementTypeSize[size_t(elementType)];
          uint64_t accessMask = uint64_t(Support::lsbMask<uint32_t>(elementSize)) << (elementIndex * elementSize);

          op._readByteMask &= accessMask;
          op._writeByteMask &= accessMask;
        }

        // TODO: [ARM] RW info is not finished.
      }
      else {
        const Mem& memOp = srcOp.as<Mem>();

        if (memOp.hasBase()) {
          op.addOpFlags(OpRWFlags::kMemBaseRead);
          if ((memOp.hasIndex() || memOp.hasOffset()) && memOp.isPreOrPost()) {
            op.addOpFlags(OpRWFlags::kMemBaseWrite);
          }
        }

        if (memOp.hasIndex()) {
          op.addOpFlags(OpRWFlags::kMemIndexRead);
        }
      }
    }
  }

  return kErrorOk;
}